

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlsafe_b64.c
# Opt level: O3

size_t urlsafe_b64_encode_(uchar *src,size_t srcSize,b64_char_t *dest,size_t destLen,uint lineLen,
                          B64_RC *rc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  size_t sVar11;
  byte *pbVar12;
  uchar dummy [3];
  byte local_5b [3];
  ulong local_58;
  char *local_50;
  B64_RC *local_48;
  size_t local_40;
  ulong local_38;
  
  auVar5._8_8_ = 0;
  auVar5._0_8_ = srcSize + 2;
  local_50 = (char *)destLen;
  if (rc == (B64_RC *)0x0) {
    __assert_fail("(((void*)0) != rc)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                  ,0x84,
                  "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                 );
  }
  sVar11 = SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
  *rc = B64_RC_OK;
  if (lineLen != 0) {
    uVar10 = (lineLen - 1) + sVar11;
    lVar8 = (uVar10 / lineLen) * 2 + -2;
    if (uVar10 < lineLen) {
      lVar8 = 0;
    }
    sVar11 = sVar11 + lVar8;
  }
  if (dest != (b64_char_t *)0x0) {
    if (destLen < sVar11) {
      *rc = B64_RC_INSUFFICIENT_BUFFER;
      sVar11 = 0;
    }
    else {
      if (2 < srcSize) {
        local_50 = dest + destLen;
        uVar10 = (ulong)lineLen;
        local_58 = 0;
        local_48 = rc;
        local_40 = sVar11;
        do {
          pbVar12 = src;
          bVar1 = *pbVar12;
          bVar2 = pbVar12[1];
          bVar3 = pbVar12[2];
          cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[bVar1 >> 2];
          *dest = cVar4;
          local_38 = srcSize;
          pvVar9 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",
                          (int)cVar4,0x41);
          if (pvVar9 == (void *)0x0) {
            __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                          "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                          ,0xc1,
                          "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                         );
          }
          if (local_58 + 1 == uVar10) {
            __assert_fail("(len != lineLen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                          ,0xc3,
                          "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                         );
          }
          cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                  [(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
          dest[1] = cVar4;
          pvVar9 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",
                          (int)cVar4,0x41);
          if (pvVar9 == (void *)0x0) {
            __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                          "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                          ,0xc6,
                          "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                         );
          }
          if (local_58 + 2 == uVar10) {
            __assert_fail("(len != lineLen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                          ,200,
                          "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                         );
          }
          cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                  [(uint)(bVar3 >> 6) + (bVar2 & 0xf) * 4];
          dest[2] = cVar4;
          pvVar9 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",
                          (int)cVar4,0x41);
          uVar6 = local_38;
          if (pvVar9 == (void *)0x0) {
            __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                          "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                          ,0xcb,
                          "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                         );
          }
          if (local_58 + 3 == uVar10) {
            __assert_fail("(len != lineLen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                          ,0xcd,
                          "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                         );
          }
          cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[bVar3 & 0x3f];
          dest[3] = cVar4;
          pvVar9 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",
                          (int)cVar4,0x41);
          if (pvVar9 == (void *)0x0) {
            __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                          "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                          ,0xd0,
                          "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                         );
          }
          local_58 = local_58 + 4;
          pcVar7 = dest + 4;
          if (dest + 4 != local_50 && local_58 == uVar10) {
            dest[4] = '\r';
            dest[5] = '\n';
            local_58 = 0;
            pcVar7 = dest + 6;
          }
          dest = pcVar7;
          srcSize = uVar6 - 3;
          src = pbVar12 + 3;
        } while (2 < srcSize);
        src = pbVar12 + 3;
        sVar11 = local_40;
        rc = local_48;
      }
      if (srcSize != 0) {
        uVar10 = 0;
        do {
          local_5b[uVar10] = src[uVar10];
          uVar10 = uVar10 + 1;
        } while (srcSize != uVar10);
        if (srcSize == 3) {
          urlsafe_b64_encode_(local_5b,3,dest,0xc,0,rc);
        }
        else {
          memset(local_5b + srcSize,0,srcSize ^ 3);
          urlsafe_b64_encode_(local_5b,3,dest,0xc,0,rc);
          memset(dest + srcSize + 1,0x3d,srcSize ^ 3);
        }
      }
    }
  }
  return sVar11;
}

Assistant:

size_t urlsafe_b64_encode_(
    unsigned char const*    src
,   size_t                  srcSize
,   b64_char_t* const       dest
,   size_t                  destLen
,   unsigned                lineLen
,   B64_RC*                 rc
)
{
	static const b64_char_t b64_chars[] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_";
    size_t total = ((srcSize + (NUM_PLAIN_DATA_BYTES - 1)) / NUM_PLAIN_DATA_BYTES) * NUM_ENCODED_DATA_BYTES;

    B64_ENFORCE_PRECONDITION(NULL != rc, "pointer to return code may not be NULL");
    *rc = B64_RC_OK;

    if(lineLen > 0)
    {
        size_t numLines = (total + (lineLen - 1)) / lineLen;

        total += 2 * (0 == numLines ? 0u : (numLines - 1));
    }

    if(NULL == dest)
    {
        return total;
    }
    else if(destLen < total)
    {
        *rc = B64_RC_INSUFFICIENT_BUFFER;

        return 0;
    }
    else
    {
        b64_char_t* p   =   dest;
        b64_char_t* end =   dest + destLen;
        size_t      len =   0;

        for(; NUM_PLAIN_DATA_BYTES <= srcSize; srcSize -= NUM_PLAIN_DATA_BYTES)
        {
            b64_char_t characters[NUM_ENCODED_DATA_BYTES];

            /* 
             * 
             * |       0       |       1       |       2       |
             *
             * |               |               |               |
             * |       |       |       |       |       |       |
             * |   |   |   |   |   |   |   |   |   |   |   |   |
             * | | | | | | | | | | | | | | | | | | | | | | | | |
             * 
             * |     0     |     1     |     2     |     3     |
             * 
             */

            /* characters[0] is the 6 left-most bits of src[0] */
            characters[0] = (b64_char_t)((src[0] & 0xfc) >> 2);
            /* characters[0] is the right-most 2 bits of src[0] and the left-most 4 bits of src[1] */
            characters[1] = (b64_char_t)(((src[0] & 0x03) << 4) + ((src[1] & 0xf0) >> 4));
            /* characters[0] is the right-most 4 bits of src[1] and the 2 left-most bits of src[2] */
            characters[2] = (b64_char_t)(((src[1] & 0x0f) << 2) + ((src[2] & 0xc0) >> 6));
            /* characters[3] is the right-most 6 bits of src[2] */
            characters[3] = (b64_char_t)(src[2] & 0x3f);

#ifndef __WATCOMC__
            B64_ENFORCE_ASSUMPTION(characters[0] >= 0 && characters[0] < 64);
            B64_ENFORCE_ASSUMPTION(characters[1] >= 0 && characters[1] < 64);
            B64_ENFORCE_ASSUMPTION(characters[2] >= 0 && characters[2] < 64);
            B64_ENFORCE_ASSUMPTION(characters[3] >= 0 && characters[3] < 64);
#endif /* __WATCOMC__ */

            src += NUM_PLAIN_DATA_BYTES;
            *p++ = b64_chars[(unsigned char)characters[0]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));
            ++len;
            B64_ENFORCE_ASSUMPTION(len != lineLen);

            *p++ = b64_chars[(unsigned char)characters[1]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));
            ++len;
            B64_ENFORCE_ASSUMPTION(len != lineLen);

            *p++ = b64_chars[(unsigned char)characters[2]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));
            ++len;
            B64_ENFORCE_ASSUMPTION(len != lineLen);

            *p++ = b64_chars[(unsigned char)characters[3]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));

            if( ++len == lineLen &&
                p != end)
            {
                *p++ = '\r';
                *p++ = '\n';
                len = 0;
            }
        }

        if(0 != srcSize)
        {
            /* Deal with the overspill, by boosting it up to three bytes (using 0s)
             * and then appending '=' for any missing characters.
             *
             * This is done into a temporary buffer, so we can call ourselves and
             * have the output continue to be written direct to the destination.
             */

            unsigned char   dummy[NUM_PLAIN_DATA_BYTES];
            size_t          i;

            for(i = 0; i != srcSize; ++i)
            {
                dummy[i] = *src++;
            }

            for(; i != NUM_PLAIN_DATA_BYTES; ++i)
            {
                dummy[i] = '\0';
            }

            urlsafe_b64_encode_(&dummy[0], NUM_PLAIN_DATA_BYTES, p, NUM_ENCODED_DATA_BYTES * (1 + 2), 0, rc);

            for(p += 1 + srcSize; srcSize++ != NUM_PLAIN_DATA_BYTES; )
            {
                *p++ = '=';
            }
        }

        return total;
    }
}